

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zesDeviceResetOverclockSettings(zes_device_handle_t hDevice,ze_bool_t onShippedState)

{
  ze_result_t zVar1;
  
  if (DAT_0010da90 != (code *)0x0) {
    zVar1 = (*DAT_0010da90)(hDevice,onShippedState);
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceResetOverclockSettings(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        ze_bool_t onShippedState                        ///< [in] True will reset to shipped state; false will reset to
                                                        ///< manufacturing state
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnResetOverclockSettings = context.zesDdiTable.Device.pfnResetOverclockSettings;
        if( nullptr != pfnResetOverclockSettings )
        {
            result = pfnResetOverclockSettings( hDevice, onShippedState );
        }
        else
        {
            // generic implementation
        }

        return result;
    }